

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

GCObject ** sweeplist(lua_State *L,GCObject **p,int countin,int *countout)

{
  byte bVar1;
  byte bVar2;
  GCObject *o;
  GCObject *local_58;
  int marked;
  GCObject *curr;
  int local_38;
  int white;
  int i;
  int ow;
  global_State *g;
  int *countout_local;
  GCObject *pGStack_18;
  int countin_local;
  GCObject **p_local;
  lua_State *L_local;
  
  bVar1 = L->l_G->currentwhite;
  bVar2 = L->l_G->currentwhite;
  pGStack_18 = (GCObject *)p;
  for (local_38 = 0; pGStack_18->next != (GCObject *)0x0 && local_38 < countin;
      local_38 = local_38 + 1) {
    o = pGStack_18->next;
    if ((o->marked & (bVar1 ^ 0x18)) == 0) {
      o->marked = o->marked & 0xc0 | bVar2 & 0x18;
      pGStack_18 = o;
    }
    else {
      pGStack_18->next = o->next;
      freeobj(L,o);
    }
  }
  if (countout != (int *)0x0) {
    *countout = local_38;
  }
  if (pGStack_18->next == (GCObject *)0x0) {
    local_58 = (GCObject *)0x0;
  }
  else {
    local_58 = pGStack_18;
  }
  return &local_58->next;
}

Assistant:

static GCObject **sweeplist (lua_State *L, GCObject **p, int countin,
                             int *countout) {
  global_State *g = G(L);
  int ow = otherwhite(g);
  int i;
  int white = luaC_white(g);  /* current white */
  for (i = 0; *p != NULL && i < countin; i++) {
    GCObject *curr = *p;
    int marked = curr->marked;
    if (isdeadm(ow, marked)) {  /* is 'curr' dead? */
      *p = curr->next;  /* remove 'curr' from list */
      freeobj(L, curr);  /* erase 'curr' */
    }
    else {  /* change mark to 'white' */
      curr->marked = cast_byte((marked & ~maskgcbits) | white);
      p = &curr->next;  /* go to next element */
    }
  }
  if (countout)
    *countout = i;  /* number of elements traversed */
  return (*p == NULL) ? NULL : p;
}